

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

void __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~MemPool
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this)

{
  MemSegment *pMVar1;
  MemSegment *__addr;
  
  __addr = this->m_segList;
  while (__addr != (MemSegment *)0x0) {
    pMVar1 = __addr->m_next;
    munmap(__addr,__addr->m_size);
    __addr = pMVar1;
  }
  return;
}

Assistant:

~MemPool()
    {
        MemSegment* seg = m_segList;
        while (seg)
        {
            void* ptr = seg;
            size_type size = seg->getSize ();
            seg = seg->getNext ();
            m_logger.logFreeSegment (ptr, size);
            m_arena.freeSegment (ptr, size);
        }
    }